

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O1

void libtorrent::merkle_validate_copy
               (span<const_libtorrent::digest32<256L>_> src,span<libtorrent::digest32<256L>_> dst,
               sha256_hash *root,bitfield *verified_leafs)

{
  sha256_hash *right;
  undefined8 *puVar1;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  digest32<256L> *pdVar12;
  ulong uVar13;
  sha256_hash *left;
  digest32<256L> *pdVar14;
  digest32<256L> *this;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pdVar14 = src.m_ptr;
  pdVar12 = dst.m_ptr;
  if (src.m_len != 0) {
    auVar18[0] = -((char)(pdVar14->m_number)._M_elems[0] == (char)(root->m_number)._M_elems[0]);
    auVar18[1] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 1) ==
                  *(char *)((long)(root->m_number)._M_elems + 1));
    auVar18[2] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 2) ==
                  *(char *)((long)(root->m_number)._M_elems + 2));
    auVar18[3] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 3) ==
                  *(char *)((long)(root->m_number)._M_elems + 3));
    auVar18[4] = -((char)(pdVar14->m_number)._M_elems[1] == (char)(root->m_number)._M_elems[1]);
    auVar18[5] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 5) ==
                  *(char *)((long)(root->m_number)._M_elems + 5));
    auVar18[6] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 6) ==
                  *(char *)((long)(root->m_number)._M_elems + 6));
    auVar18[7] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 7) ==
                  *(char *)((long)(root->m_number)._M_elems + 7));
    auVar18[8] = -((char)(pdVar14->m_number)._M_elems[2] == (char)(root->m_number)._M_elems[2]);
    auVar18[9] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 9) ==
                  *(char *)((long)(root->m_number)._M_elems + 9));
    auVar18[10] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 10) ==
                   *(char *)((long)(root->m_number)._M_elems + 10));
    auVar18[0xb] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0xb) ==
                    *(char *)((long)(root->m_number)._M_elems + 0xb));
    auVar18[0xc] = -((char)(pdVar14->m_number)._M_elems[3] == (char)(root->m_number)._M_elems[3]);
    auVar18[0xd] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0xd) ==
                    *(char *)((long)(root->m_number)._M_elems + 0xd));
    auVar18[0xe] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0xe) ==
                    *(char *)((long)(root->m_number)._M_elems + 0xe));
    auVar18[0xf] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0xf) ==
                    *(char *)((long)(root->m_number)._M_elems + 0xf));
    auVar17[0] = -((char)(pdVar14->m_number)._M_elems[4] == (char)(root->m_number)._M_elems[4]);
    auVar17[1] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x11) ==
                  *(char *)((long)(root->m_number)._M_elems + 0x11));
    auVar17[2] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x12) ==
                  *(char *)((long)(root->m_number)._M_elems + 0x12));
    auVar17[3] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x13) ==
                  *(char *)((long)(root->m_number)._M_elems + 0x13));
    auVar17[4] = -((char)(pdVar14->m_number)._M_elems[5] == (char)(root->m_number)._M_elems[5]);
    auVar17[5] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x15) ==
                  *(char *)((long)(root->m_number)._M_elems + 0x15));
    auVar17[6] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x16) ==
                  *(char *)((long)(root->m_number)._M_elems + 0x16));
    auVar17[7] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x17) ==
                  *(char *)((long)(root->m_number)._M_elems + 0x17));
    auVar17[8] = -((char)(pdVar14->m_number)._M_elems[6] == (char)(root->m_number)._M_elems[6]);
    auVar17[9] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x19) ==
                  *(char *)((long)(root->m_number)._M_elems + 0x19));
    auVar17[10] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x1a) ==
                   *(char *)((long)(root->m_number)._M_elems + 0x1a));
    auVar17[0xb] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x1b) ==
                    *(char *)((long)(root->m_number)._M_elems + 0x1b));
    auVar17[0xc] = -((char)(pdVar14->m_number)._M_elems[7] == (char)(root->m_number)._M_elems[7]);
    auVar17[0xd] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x1d) ==
                    *(char *)((long)(root->m_number)._M_elems + 0x1d));
    auVar17[0xe] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x1e) ==
                    *(char *)((long)(root->m_number)._M_elems + 0x1e));
    auVar17[0xf] = -(*(char *)((long)(pdVar14->m_number)._M_elems + 0x1f) ==
                    *(char *)((long)(root->m_number)._M_elems + 0x1f));
    auVar17 = auVar17 & auVar18;
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
      uVar3 = *(undefined8 *)(pdVar14->m_number)._M_elems;
      uVar4 = *(undefined8 *)((pdVar14->m_number)._M_elems + 2);
      uVar5 = *(undefined8 *)((pdVar14->m_number)._M_elems + 6);
      *(undefined8 *)((pdVar12->m_number)._M_elems + 4) =
           *(undefined8 *)((pdVar14->m_number)._M_elems + 4);
      *(undefined8 *)((pdVar12->m_number)._M_elems + 6) = uVar5;
      *(undefined8 *)(pdVar12->m_number)._M_elems = uVar3;
      *(undefined8 *)((pdVar12->m_number)._M_elems + 2) = uVar4;
      uVar7 = (int)src.m_len - (int)((dst.m_len - (dst.m_len + 1 >> 0x3f)) + 1 >> 1);
      if (0 < (int)uVar7) {
        uVar13 = (ulong)(uVar7 & 0x7fffffff);
        iVar15 = 1;
        lVar16 = 0;
        this = pdVar12;
        do {
          bVar6 = digest32<256L>::is_all_zeros(this);
          if (!bVar6) {
            left = (sha256_hash *)((long)pdVar14[1].m_number._M_elems + lVar16);
            right = (sha256_hash *)((long)pdVar14[2].m_number._M_elems + lVar16);
            bVar6 = merkle_validate_node(left,right,this);
            if (bVar6) {
              uVar3 = *(undefined8 *)(left->m_number)._M_elems;
              uVar4 = *(undefined8 *)((long)pdVar14[1].m_number._M_elems + lVar16 + 8);
              uVar5 = *(undefined8 *)((long)pdVar14[1].m_number._M_elems + lVar16 + 0x18);
              puVar1 = (undefined8 *)((long)pdVar12[1].m_number._M_elems + lVar16 + 0x10);
              *puVar1 = *(undefined8 *)((long)pdVar14[1].m_number._M_elems + lVar16 + 0x10);
              puVar1[1] = uVar5;
              puVar1 = (undefined8 *)((long)pdVar12[1].m_number._M_elems + lVar16);
              *puVar1 = uVar3;
              puVar1[1] = uVar4;
              uVar5 = *(undefined8 *)((right->m_number)._M_elems + 2);
              uVar3 = *(undefined8 *)((right->m_number)._M_elems + 4);
              uVar4 = *(undefined8 *)((right->m_number)._M_elems + 6);
              puVar1 = (undefined8 *)((long)pdVar12[2].m_number._M_elems + lVar16);
              *puVar1 = *(undefined8 *)(right->m_number)._M_elems;
              puVar1[1] = uVar5;
              puVar1 = (undefined8 *)((long)pdVar12[2].m_number._M_elems + lVar16 + 0x10);
              *puVar1 = uVar3;
              puVar1[1] = uVar4;
              if ((int)uVar7 <= iVar15) {
                _Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                     (verified_leafs->m_buf).
                     super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                     super__Head_base<0UL,_unsigned_int_*,_false>;
                if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0)
                {
                  iVar11 = 0;
                }
                else {
                  iVar11 = *(int *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
                }
                iVar8 = -uVar7 + iVar15;
                if (iVar8 < iVar11) {
                  uVar10 = 0x80000000 >> ((byte)iVar8 & 0x1f);
                  iVar11 = iVar8 + 0x1f;
                  if (-1 < iVar8) {
                    iVar11 = iVar8;
                  }
                  ((int *)((long)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4
                          ))[iVar11 >> 5] =
                       ((int *)((long)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>.
                                      _M_head_impl + 4))[iVar11 >> 5] |
                       uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                       uVar10 << 0x18;
                  if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0
                     ) {
                    iVar11 = 0;
                  }
                  else {
                    iVar11 = *(int *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                    ;
                  }
                  iVar8 = -uVar7 + iVar15;
                  iVar9 = iVar8 + 1;
                  if (iVar9 < iVar11) {
                    uVar10 = 0x80000000 >> ((byte)iVar9 & 0x1f);
                    iVar11 = iVar8 + 0x20;
                    if (-1 < iVar9) {
                      iVar11 = iVar9;
                    }
                    ((int *)((long)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                            4))[iVar11 >> 5] =
                         ((int *)((long)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>.
                                        _M_head_impl + 4))[iVar11 >> 5] |
                         uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18;
                  }
                }
              }
            }
          }
          this = this + 1;
          lVar16 = lVar16 + 0x40;
          iVar15 = iVar15 + 2;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
    }
  }
  return;
}

Assistant:

void merkle_validate_copy(span<sha256_hash const> const src
		, span<sha256_hash> const dst, sha256_hash const& root
		, bitfield& verified_leafs)
	{
		TORRENT_ASSERT(src.size() == dst.size());
		int const num_leafs = int((dst.size() + 1) / 2);
		if (src.empty()) return;
		if (src[0] != root) return;
		dst[0] = src[0];
		int const leaf_layer_start = int(src.size() - num_leafs);
		for (int i = 0; i < leaf_layer_start; ++i)
		{
			if (dst[i].is_all_zeros()) continue;
			int const left_child = merkle_get_first_child(i);
			int const right_child = left_child + 1;
			if (merkle_validate_node(src[left_child], src[right_child], dst[i]))
			{
				dst[left_child] = src[left_child];
				dst[right_child] = src[right_child];
				int const block_idx = left_child - leaf_layer_start;
				if (left_child >= leaf_layer_start
					&& block_idx < verified_leafs.size())
				{
					verified_leafs.set_bit(block_idx);
					// the right child may be the first block of padding hash,
					// in which case it's not part of the verified bitfield
					if (block_idx + 1 < verified_leafs.size())
						verified_leafs.set_bit(block_idx + 1);
				}
			}
		}
	}